

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveFile::writeTempData(CDirectiveFile *this,TempData *tempData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *in_R8;
  long *in_R9;
  string str;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Alloc_hider local_28;
  
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  switch(*(undefined4 *)&(this->super_CAssemblerCommand).field_0x14) {
  case 1:
    iVar2 = (*(((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_(&local_a8,(path *)CONCAT44(extraout_var,iVar2));
    local_48._M_dataplus._M_p =
         (pointer)((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->originalHeaderSize;
    tinyformat::format<std::__cxx11::string,long>
              (&local_88,(tinyformat *)".open \"%s\",0x%08X",(char *)&local_a8,&local_48,in_R8);
    break;
  case 2:
    iVar2 = (*(((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_(&local_a8,(path *)CONCAT44(extraout_var_01,iVar2));
    local_48._M_dataplus._M_p =
         (pointer)((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->originalHeaderSize;
    tinyformat::format<std::__cxx11::string,long>
              (&local_88,(tinyformat *)".create \"%s\",0x%08X",(char *)&local_a8,&local_48,in_R8);
    break;
  case 3:
    ghc::filesystem::path::u8string_abi_cxx11_
              (&local_a8,
               &((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->originalName);
    iVar2 = (*(((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_(&local_48,(path *)CONCAT44(extraout_var_00,iVar2));
    local_28._M_p =
         (pointer)((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->originalHeaderSize;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,long>
              (&local_88,(tinyformat *)".open \"%s\",\"%s\",0x%08X",(char *)&local_a8,&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,in_R9)
    ;
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_88._M_dataplus._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) goto LAB_00171756;
    goto LAB_0017175e;
  case 4:
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,0x1918d0);
  default:
    goto switchD_00171600_default;
  }
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
  local_48.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_00171756:
    operator_delete(local_88._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
LAB_0017175e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
switchD_00171600_default:
  TempData::writeLine(tempData,this->virtualAddress,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void CDirectiveFile::writeTempData(TempData& tempData) const
{
	std::string str;

	switch (type)
	{
	case Type::Open:
		str = tfm::format(".open \"%s\",0x%08X",file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Create:
		str = tfm::format(".create \"%s\",0x%08X",file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Copy:
		str = tfm::format(".open \"%s\",\"%s\",0x%08X",file->getOriginalFileName().u8string(),
			file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Close:
		str = ".close";
		break;
	case Type::Invalid:
		// TODO: Assert?
		break;
	}

	tempData.writeLine(virtualAddress,str);
}